

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

iterator __thiscall
absl::lts_20250127::
InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::erase(InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
        *this,const_iterator pos)

{
  size_type *psVar1;
  ulong uVar2;
  bool bVar3;
  Iterator<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar4;
  undefined7 extraout_var;
  iterator extraout_RAX;
  const_iterator pPVar6;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar7;
  iterator pPVar5;
  
  uVar2 = (this->storage_).metadata_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if ((uVar2 & 1) == 0) {
    pPVar6 = (const_iterator)&(this->storage_).data_;
  }
  else {
    pPVar6 = (this->storage_).data_.allocated.allocated_data;
  }
  if (pos < pPVar6) {
    InlinedVector<absl::lts_20250127::status_internal::Payload,1ul,std::allocator<absl::lts_20250127::status_internal::Payload>>
    ::erase();
  }
  else if (pos < pPVar6 + (uVar2 >> 1)) {
    pPVar4 = inlined_vector_internal::
             Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
             ::Erase(&this->storage_,pos,pos + 1);
    return pPVar4;
  }
  InlinedVector<absl::lts_20250127::status_internal::Payload,1ul,std::allocator<absl::lts_20250127::status_internal::Payload>>
  ::erase();
  uVar2 = (this->storage_).metadata_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if (pos < (const_iterator)(uVar2 >> 1)) {
    if ((uVar2 & 1) == 0) {
      pPVar7 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
               &(this->storage_).data_;
    }
    else {
      pPVar7 = (this->storage_).data_.allocated.allocated_data;
    }
    return pPVar7 + (long)pos;
  }
  InlinedVector<absl::lts_20250127::status_internal::Payload,1ul,std::allocator<absl::lts_20250127::status_internal::Payload>>
  ::operator[]();
  pPVar5 = (iterator)(pos->type_url)._M_string_length;
  if (pPVar5 == (iterator)0x0 || ((ulong)(pos->type_url)._M_dataplus._M_p & 1) == 0) {
    pPVar7 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
             (pos->type_url)._M_string_length;
    (this->storage_).metadata_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value =
         (unsigned_long)(pos->type_url)._M_dataplus._M_p;
    (this->storage_).data_.allocated.allocated_data = pPVar7;
  }
  else {
    LOCK();
    psVar1 = &(pPVar5->type_url)._M_string_length;
    *(int *)psVar1 = (int)*psVar1 + 2;
    UNLOCK();
    (this->storage_).data_.allocated.allocated_data = pPVar5;
    (this->storage_).metadata_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value = 1;
    bVar3 = cord_internal::InlineData::is_either_profiled((InlineData *)this,(InlineData *)pos);
    pPVar5 = (iterator)CONCAT71(extraout_var,bVar3);
    if (bVar3) {
      cord_internal::CordzInfo::MaybeTrackCordImpl
                ((InlineData *)this,(InlineData *)pos,kConstructorCord);
      return extraout_RAX;
    }
  }
  return pPVar5;
}

Assistant:

iterator erase(const_iterator pos) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    ABSL_HARDENING_ASSERT(pos >= begin());
    ABSL_HARDENING_ASSERT(pos < end());

    // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=102329#c2
    // It appears that GCC thinks that since `pos` is a const pointer and may
    // point to uninitialized memory at this point, a warning should be
    // issued. But `pos` is actually only used to compute an array index to
    // write to.
#if !defined(__clang__) && defined(__GNUC__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wmaybe-uninitialized"
#pragma GCC diagnostic ignored "-Wuninitialized"
#endif
    return storage_.Erase(pos, pos + 1);
#if !defined(__clang__) && defined(__GNUC__)
#pragma GCC diagnostic pop
#endif
  }